

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_body_slot(parser *p)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  char *pcVar4;
  long *plStack_28;
  wchar_t n;
  equip_slot *slot;
  player_body *b;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    plStack_28 = *(long **)((long)pvVar2 + 0x18);
    if (plStack_28 == (long *)0x0) {
      pvVar3 = mem_zalloc(0x20);
      *(void **)((long)pvVar2 + 0x18) = pvVar3;
      plStack_28 = *(long **)((long)pvVar2 + 0x18);
    }
    else {
      for (; *plStack_28 != 0; plStack_28 = (long *)*plStack_28) {
      }
      pvVar3 = mem_zalloc(0x20);
      *plStack_28 = (long)pvVar3;
      plStack_28 = (long *)*plStack_28;
    }
    pcVar4 = parser_getsym(p,"slot");
    iVar1 = lookup_flag(slots,pcVar4);
    if (iVar1 == 0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_FLAG;
    }
    else {
      *(short *)((long)plStack_28 + 8) = (short)iVar1;
      pcVar4 = parser_getsym(p,"name");
      pcVar4 = string_make(pcVar4);
      *(char **)((long)plStack_28 + 0x10) = pcVar4;
      *(short *)((long)pvVar2 + 0x10) = *(short *)((long)pvVar2 + 0x10) + 1;
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_body_slot(struct parser *p) {
	struct player_body *b = parser_priv(p);
	struct equip_slot *slot;
	int n;

	if (!b) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Go to the last valid slot, then allocate a new one */
	slot = b->slots;
	if (!slot) {
		b->slots = mem_zalloc(sizeof(struct equip_slot));
		slot = b->slots;
	} else {
		while (slot->next) slot = slot->next;
		slot->next = mem_zalloc(sizeof(struct equip_slot));
		slot = slot->next;
	}

	n = lookup_flag(slots, parser_getsym(p, "slot"));
	if (!n) {
		return PARSE_ERROR_INVALID_FLAG;
	}
	slot->type = n;
	slot->name = string_make(parser_getsym(p, "name"));
	b->count++;
	return PARSE_ERROR_NONE;
}